

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

string * findModelObjectiveName_abi_cxx11_(HighsLp *lp,HighsHessian *hessian)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  int *in_RDX;
  int *in_RSI;
  string *in_RDI;
  string trimmed_name;
  HighsInt iRow;
  bool ok_objective_name;
  HighsInt pass;
  HighsInt iCol;
  bool has_objective;
  string *objective_name;
  string *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *str;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int local_40;
  int local_38;
  int local_34;
  undefined1 local_1a [10];
  int *local_10;
  
  local_1a._2_8_ = in_RDX;
  local_10 = in_RSI;
  bVar2 = std::operator!=(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  if (bVar2) {
    std::__cxx11::string::string((string *)in_RDI,(string *)(local_10 + 0x48));
  }
  else {
    local_1a[1] = 0;
    str = (string *)local_1a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)str);
    std::allocator<char>::~allocator((allocator<char> *)local_1a);
    bVar2 = false;
    for (local_34 = 0; local_34 < *local_10; local_34 = local_34 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_34);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        bVar2 = true;
        break;
      }
    }
    if ((!bVar2) && ((int *)local_1a._2_8_ != (int *)0x0)) {
      bVar2 = *(int *)local_1a._2_8_ != 0;
    }
    local_38 = 0;
    while( true ) {
      if (bVar2) {
        std::__cxx11::string::operator=((string *)in_RDI,"Obj");
      }
      else {
        std::__cxx11::string::operator=((string *)in_RDI,"NoObj");
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_10 + 0x58));
      if (sVar5 == 0) break;
      if (local_38 != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,(char)local_38);
      }
      bVar1 = true;
      for (local_40 = 0; local_40 < local_10[1]; local_40 = local_40 + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_10 + 0x58),(long)local_40);
        std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,(string *)pvVar6);
        in_stack_ffffffffffffff78 = trim(str,in_stack_ffffffffffffff78);
        std::__cxx11::string::operator=
                  ((string *)&stack0xffffffffffffffa0,(string *)in_stack_ffffffffffffff78);
        _Var3 = std::operator==(in_stack_ffffffffffffffa0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (_Var3) {
          bVar1 = false;
          in_stack_ffffffffffffff9c = 7;
        }
        else {
          in_stack_ffffffffffffff9c = 0;
        }
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        if (in_stack_ffffffffffffff9c != 0) break;
      }
      if (bVar1) {
        return in_RDI;
      }
      local_38 = local_38 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::string findModelObjectiveName(const HighsLp* lp,
                                   const HighsHessian* hessian) {
  // Return any non-trivial current objective name
  if (lp->objective_name_ != "") return lp->objective_name_;

  std::string objective_name = "";
  // Determine whether there is a nonzero cost vector
  bool has_objective = false;
  for (HighsInt iCol = 0; iCol < lp->num_col_; iCol++) {
    if (lp->col_cost_[iCol]) {
      has_objective = true;
      break;
    }
  }
  if (!has_objective && hessian) {
    // Zero cost vector, so only chance of an objective comes from any
    // Hessian
    has_objective = (hessian->dim_ != 0);
  }
  HighsInt pass = 0;
  for (;;) {
    // Loop until a valid name is found. Vanishingly unlikely to have
    // to pass more than once, since check for objective name
    // duplicating a row name is very unlikely to fail
    //
    // So set up an appropriate name (stem)
    if (has_objective) {
      objective_name = "Obj";
    } else {
      objective_name = "NoObj";
    }
    // If there are no row names, then the objective name is certainly
    // OK
    if (lp->row_names_.size() == 0) break;
    if (pass != 0) objective_name += pass;
    // Ensure that the objective name doesn't clash with any row names
    bool ok_objective_name = true;
    for (HighsInt iRow = 0; iRow < lp->num_row_; iRow++) {
      std::string trimmed_name = lp->row_names_[iRow];
      trimmed_name = trim(trimmed_name);
      if (objective_name == trimmed_name) {
        ok_objective_name = false;
        break;
      }
    }
    if (ok_objective_name) break;
    pass++;
  }
  assert(objective_name != "");
  return objective_name;
}